

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wsi.c
# Opt level: O1

int lws_callback_all_protocol_vhost_args
              (lws_vhost *vh,lws_protocols *protocol,int reason,void *argp,size_t len)

{
  lws_context *context;
  lws *plVar1;
  int iVar2;
  ulong uVar3;
  lws_context_per_thread *plVar4;
  
  context = vh->context;
  iVar2 = (int)context->count_threads;
  if (context->count_threads != 0) {
    plVar4 = context->pt;
    do {
      if (plVar4->fds_count != 0) {
        uVar3 = 0;
        do {
          plVar1 = wsi_from_fd(context,plVar4->fds[uVar3].fd);
          if (((plVar1 != (lws *)0x0) && (plVar1->vhost == vh)) &&
             ((protocol == (lws_protocols *)0x0 || (plVar1->protocol == protocol)))) {
            (*plVar1->protocol->callback)(plVar1,reason,plVar1->user_space,argp,len);
          }
          uVar3 = uVar3 + 1;
        } while (uVar3 < plVar4->fds_count);
      }
      iVar2 = iVar2 + -1;
      plVar4 = plVar4 + 1;
    } while (iVar2 != 0);
  }
  return 0;
}

Assistant:

int
lws_callback_all_protocol_vhost_args(struct lws_vhost *vh,
			  const struct lws_protocols *protocol, int reason,
			  void *argp, size_t len)
{
	struct lws_context *context = vh->context;
	struct lws_context_per_thread *pt = &context->pt[0];
	unsigned int n, m = context->count_threads;
	struct lws *wsi;

	while (m--) {
		for (n = 0; n < pt->fds_count; n++) {
			wsi = wsi_from_fd(context, pt->fds[n].fd);
			if (!wsi)
				continue;
			if (wsi->vhost == vh && (wsi->protocol == protocol ||
						 !protocol))
				wsi->protocol->callback(wsi, reason,
						wsi->user_space, argp, len);
		}
		pt++;
	}

	return 0;
}